

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O2

void duckdb_je_hpa_shard_set_deferral_allowed
               (tsdn_t *tsdn,hpa_shard_t *shard,_Bool deferral_allowed)

{
  _Bool _Var1;
  
  malloc_mutex_lock(tsdn,&shard->mtx);
  _Var1 = (shard->opts).deferral_allowed;
  (shard->opts).deferral_allowed = deferral_allowed;
  if (_Var1 == true && !deferral_allowed) {
    hpa_shard_maybe_do_deferred_work(tsdn,shard,true);
  }
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48));
  return;
}

Assistant:

void
hpa_shard_set_deferral_allowed(tsdn_t *tsdn, hpa_shard_t *shard,
    bool deferral_allowed) {
	hpa_do_consistency_checks(shard);

	malloc_mutex_lock(tsdn, &shard->mtx);
	bool deferral_previously_allowed = shard->opts.deferral_allowed;
	shard->opts.deferral_allowed = deferral_allowed;
	if (deferral_previously_allowed && !deferral_allowed) {
		hpa_shard_maybe_do_deferred_work(tsdn, shard,
		    /* forced */ true);
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
}